

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.h
# Opt level: O3

void __thiscall cmGraphVizWriter::Connection::Connection(Connection *this,Connection *param_1)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->src).String._M_dataplus._M_p = (pointer)&(this->src).String.field_2;
  pcVar1 = (param_1->src).String._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->src).String._M_string_length);
  (this->src).Cross = (param_1->src).Cross;
  (this->src).Target = (param_1->src).Target;
  (this->src).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (param_1->src).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var2 = (param_1->src).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->src).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->dst).String._M_dataplus._M_p = (pointer)&(this->dst).String.field_2;
  pcVar1 = (param_1->dst).String._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->dst,pcVar1,pcVar1 + (param_1->dst).String._M_string_length);
  (this->dst).Cross = (param_1->dst).Cross;
  (this->dst).Target = (param_1->dst).Target;
  (this->dst).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (param_1->dst).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
            TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var2 = (param_1->dst).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
           TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->dst).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->scopeType)._M_dataplus._M_p = (pointer)&(this->scopeType).field_2;
  pcVar1 = (param_1->scopeType)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->scopeType,pcVar1,pcVar1 + (param_1->scopeType)._M_string_length);
  return;
}

Assistant:

Connection(cmLinkItem s, cmLinkItem d, std::string scope)
      : src(std::move(s))
      , dst(std::move(d))
      , scopeType(std::move(scope))
    {
    }